

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5ConfigSetValue(Fts5Config *pConfig,char *zKey,sqlite3_value *pVal,int *pbBadkey)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  i64 iVar4;
  char *zIn;
  uint uVar5;
  long lVar6;
  char *zRankArgs;
  char *zRank;
  char *local_28;
  char *local_20;
  
  if (zKey != (char *)0x0) {
    lVar6 = 0;
    do {
      bVar1 = zKey[lVar6];
      if (bVar1 == "pgsz"[lVar6]) {
        if ((ulong)bVar1 == 0) goto LAB_001c8a88;
      }
      else if (""[bVar1] != ""[(byte)"pgsz"[lVar6]]) {
        lVar6 = 0;
        goto LAB_001c8ac2;
      }
      lVar6 = lVar6 + 1;
    } while( true );
  }
LAB_001c8cbc:
  *pbBadkey = 1;
  return 0;
LAB_001c8ac2:
  bVar1 = zKey[lVar6];
  if (bVar1 == "hashsize"[lVar6]) {
    if ((ulong)bVar1 == 0) goto LAB_001c8ae6;
  }
  else if (""[bVar1] != ""[(byte)"hashsize"[lVar6]]) {
    lVar6 = 0;
    goto LAB_001c8b1b;
  }
  lVar6 = lVar6 + 1;
  goto LAB_001c8ac2;
LAB_001c8b1b:
  bVar1 = zKey[lVar6];
  if (bVar1 == "automerge"[lVar6]) {
    if ((ulong)bVar1 == 0) goto LAB_001c8b3f;
  }
  else if (""[bVar1] != ""[(byte)"automerge"[lVar6]]) {
    lVar6 = 0;
    goto LAB_001c8b80;
  }
  lVar6 = lVar6 + 1;
  goto LAB_001c8b1b;
LAB_001c8b80:
  bVar1 = zKey[lVar6];
  if (bVar1 == "usermerge"[lVar6]) {
    if ((ulong)bVar1 == 0) goto LAB_001c8ba4;
  }
  else if (""[bVar1] != ""[(byte)"usermerge"[lVar6]]) {
    lVar6 = 0;
    goto LAB_001c8bdd;
  }
  lVar6 = lVar6 + 1;
  goto LAB_001c8b80;
LAB_001c8bdd:
  bVar1 = zKey[lVar6];
  if (bVar1 == "crisismerge"[lVar6]) {
    if ((ulong)bVar1 == 0) goto LAB_001c8c01;
  }
  else if (""[bVar1] != ""[(byte)"crisismerge"[lVar6]]) {
    lVar6 = 0;
    goto LAB_001c8c41;
  }
  lVar6 = lVar6 + 1;
  goto LAB_001c8bdd;
LAB_001c8c41:
  bVar1 = zKey[lVar6];
  if (bVar1 == "rank"[lVar6]) {
    if ((ulong)bVar1 == 0) goto LAB_001c8c65;
  }
  else if (""[bVar1] != ""[(byte)"rank"[lVar6]]) goto LAB_001c8cbc;
  lVar6 = lVar6 + 1;
  goto LAB_001c8c41;
LAB_001c8c65:
  zIn = (char *)sqlite3ValueText(pVal,'\x01');
  iVar2 = sqlite3Fts5ConfigParseRank(zIn,&local_20,&local_28);
  if (iVar2 != 1) {
    if (iVar2 == 0) {
      sqlite3_free(pConfig->zRank);
      sqlite3_free(pConfig->zRankArgs);
      pConfig->zRank = local_20;
      pConfig->zRankArgs = local_28;
      return 0;
    }
    return iVar2;
  }
  goto LAB_001c8cbc;
LAB_001c8c01:
  iVar2 = sqlite3_value_numeric_type(pVal);
  if (iVar2 == 1) {
    iVar4 = sqlite3VdbeIntValue(pVal);
    uVar3 = (uint)iVar4;
    if (-1 < (int)uVar3) {
      uVar5 = 0x10;
      if (1 < uVar3) {
        uVar5 = uVar3;
      }
      pConfig->nCrisisMerge = uVar5;
      return 0;
    }
  }
  goto LAB_001c8cbc;
LAB_001c8ba4:
  iVar2 = sqlite3_value_numeric_type(pVal);
  if (iVar2 == 1) {
    iVar4 = sqlite3VdbeIntValue(pVal);
    if (0xfffffff0 < (int)iVar4 - 0x11U) {
      pConfig->nUsermerge = (int)iVar4;
      return 0;
    }
  }
  goto LAB_001c8cbc;
LAB_001c8b3f:
  iVar2 = sqlite3_value_numeric_type(pVal);
  if (iVar2 == 1) {
    iVar4 = sqlite3VdbeIntValue(pVal);
    uVar3 = (uint)iVar4;
    if (uVar3 < 0x41) {
      uVar5 = 4;
      if (uVar3 != 1) {
        uVar5 = uVar3;
      }
      pConfig->nAutomerge = uVar5;
      return 0;
    }
  }
  goto LAB_001c8cbc;
LAB_001c8ae6:
  iVar2 = sqlite3_value_numeric_type(pVal);
  if (iVar2 == 1) {
    iVar4 = sqlite3VdbeIntValue(pVal);
    if (0 < (int)iVar4) {
      pConfig->nHashSize = (int)iVar4;
      return 0;
    }
  }
  goto LAB_001c8cbc;
LAB_001c8a88:
  iVar2 = sqlite3_value_numeric_type(pVal);
  if (iVar2 == 1) {
    iVar4 = sqlite3VdbeIntValue(pVal);
    if (0xfffdffff < (int)iVar4 - 0x20001U) {
      pConfig->pgsz = (int)iVar4;
      return 0;
    }
  }
  goto LAB_001c8cbc;
}

Assistant:

static int sqlite3Fts5ConfigSetValue(
  Fts5Config *pConfig, 
  const char *zKey, 
  sqlite3_value *pVal,
  int *pbBadkey
){
  int rc = SQLITE_OK;

  if( 0==sqlite3_stricmp(zKey, "pgsz") ){
    int pgsz = 0;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      pgsz = sqlite3_value_int(pVal);
    }
    if( pgsz<=0 || pgsz>FTS5_MAX_PAGE_SIZE ){
      *pbBadkey = 1;
    }else{
      pConfig->pgsz = pgsz;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "hashsize") ){
    int nHashSize = -1;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      nHashSize = sqlite3_value_int(pVal);
    }
    if( nHashSize<=0 ){
      *pbBadkey = 1;
    }else{
      pConfig->nHashSize = nHashSize;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "automerge") ){
    int nAutomerge = -1;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      nAutomerge = sqlite3_value_int(pVal);
    }
    if( nAutomerge<0 || nAutomerge>64 ){
      *pbBadkey = 1;
    }else{
      if( nAutomerge==1 ) nAutomerge = FTS5_DEFAULT_AUTOMERGE;
      pConfig->nAutomerge = nAutomerge;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "usermerge") ){
    int nUsermerge = -1;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      nUsermerge = sqlite3_value_int(pVal);
    }
    if( nUsermerge<2 || nUsermerge>16 ){
      *pbBadkey = 1;
    }else{
      pConfig->nUsermerge = nUsermerge;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "crisismerge") ){
    int nCrisisMerge = -1;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      nCrisisMerge = sqlite3_value_int(pVal);
    }
    if( nCrisisMerge<0 ){
      *pbBadkey = 1;
    }else{
      if( nCrisisMerge<=1 ) nCrisisMerge = FTS5_DEFAULT_CRISISMERGE;
      pConfig->nCrisisMerge = nCrisisMerge;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "rank") ){
    const char *zIn = (const char*)sqlite3_value_text(pVal);
    char *zRank;
    char *zRankArgs;
    rc = sqlite3Fts5ConfigParseRank(zIn, &zRank, &zRankArgs);
    if( rc==SQLITE_OK ){
      sqlite3_free(pConfig->zRank);
      sqlite3_free(pConfig->zRankArgs);
      pConfig->zRank = zRank;
      pConfig->zRankArgs = zRankArgs;
    }else if( rc==SQLITE_ERROR ){
      rc = SQLITE_OK;
      *pbBadkey = 1;
    }
  }else{
    *pbBadkey = 1;
  }
  return rc;
}